

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PacketProcessor.cpp
# Opt level: O0

void __thiscall PacketProcessor::feed(PacketProcessor *this,void *d,size_t size)

{
  bool bVar1;
  uint32_t uVar2;
  size_type sVar3;
  reference pvVar4;
  mutex *__m;
  undefined8 uVar5;
  __normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_88;
  const_iterator local_80;
  string local_68 [32];
  lock_guard<std::mutex> local_48;
  lock_guard<std::mutex> lock;
  unsigned_long needSize;
  type_conflict i;
  size_t startPos;
  uint8_t *data;
  size_t size_local;
  void *d_local;
  PacketProcessor *this_local;
  
  if (size == 0) {
    return;
  }
  i = 0;
  bVar1 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty(&this->buffer_);
  if (bVar1) {
LAB_001064a9:
    for (needSize = 0; needSize < size; needSize = needSize + 1) {
      if (*(char *)((long)d + needSize) == 'Z') {
        if (size <= needSize + 1) {
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                    (&this->buffer_,(value_type *)((long)d + needSize));
          return;
        }
        if (*(char *)((long)d + needSize + 1) == -0x5b) {
          i = needSize;
          goto LAB_001065b9;
        }
      }
    }
  }
  else {
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
    if (sVar3 == 1) {
      pvVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator[]
                         (&this->buffer_,0);
      if (*pvVar4 != 'Z') {
        __assert_fail("buffer_[0] == H_1",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/shuai132[P]PacketProcessor/PacketProcessor.cpp"
                      ,0x7b,"void PacketProcessor::feed(const void *, size_t)");
      }
      if (*d != -0x5b) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::clear(&this->buffer_);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::shrink_to_fit(&this->buffer_);
        goto LAB_001064a9;
      }
    }
LAB_001065b9:
    sVar3 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size(&this->buffer_);
    lock._M_device = (mutex_type *)((sVar3 + size) - i);
    if ((mutex_type *)(ulong)this->maxBufferSize_ < lock._M_device) {
      __m = L_O_G_NS_MUTEX::mutex();
      std::lock_guard<std::mutex>::lock_guard(&local_48,__m);
      L_O_G_NS_GET_TIME::get_time_abi_cxx11_();
      uVar5 = std::__cxx11::string::c_str();
      uVar2 = L_O_G_NS_GET_TID::get_tid();
      printf("\x1b[35m%s %u [W]: %s:%d [%s] size too big, need: %zu, max: %zu\x1b[m\n",uVar5,
             (ulong)uVar2,"PacketProcessor.cpp",0x87,"feed",lock._M_device,
             (ulong)this->maxBufferSize_);
      std::__cxx11::string::~string(local_68);
      std::lock_guard<std::mutex>::~lock_guard(&local_48);
      clearBuffer(this);
      return;
    }
    local_88._M_current =
         (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end(&this->buffer_);
    __gnu_cxx::
    __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
    ::__normal_iterator<unsigned_char*>
              ((__normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
                *)&local_80,&local_88);
    std::vector<unsigned_char,std::allocator<unsigned_char>>::insert<unsigned_char_const*,void>
              ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,local_80,
               (uchar *)((long)d + i),(uchar *)((long)d + (size - i)));
  }
  tryUnpack(this);
  return;
}

Assistant:

void PacketProcessor::feed(const void* d, size_t size) {
  const uint8_t* data = (uint8_t*)d;
  if (size == 0) return;
  PacketProcessor_LOGV("feed: %u", size);

  // 缓存数据(当遇到包头后才开始缓存)
  size_t startPos = 0;
  if (buffer_.empty()) {
  START_HEADER:
    FOR(i, size) {
      if (data[i] == H_1) {
        if (i + 1 < size) {
          if (data[i + 1] == H_2) {
            startPos = i;
            goto START_BUFFER;
          } else {
            continue;
          }
        } else {
          buffer_.push_back(data[i]);
          return;
        }
      }
    }
  } else if (buffer_.size() == 1) {
    assert(buffer_[0] == H_1);
    if (data[0] == H_2)
      goto START_BUFFER;
    else {
      buffer_.clear();
      buffer_.shrink_to_fit();
      goto START_HEADER;
    }
  } else {
  START_BUFFER:
    const auto needSize = buffer_.size() + size - startPos;
    if (needSize > maxBufferSize_) {
      PacketProcessor_LOGW("size too big, need: %zu, max: %zu", needSize, (size_t)maxBufferSize_);
      clearBuffer();
      return;
    }
    buffer_.insert(buffer_.end(), data + startPos, data + size - startPos);
  }

  // 尝试解包
  tryUnpack();
}